

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

LocalFederateId __thiscall
helics::CommonCore::registerFederate(CommonCore *this,string_view name,CoreFederateInfo *info)

{
  uint uVar1;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *p_Var2;
  long lVar3;
  pointer ppVar4;
  pointer pcVar5;
  string_view message;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar6;
  value<fmt::v11::context> *pvVar7;
  bool bVar8;
  FederateStates FVar9;
  IterationResult IVar10;
  int iVar11;
  size_type __n1;
  _Storage<unsigned_long,_true> _Var12;
  const_iterator cVar13;
  size_type sVar14;
  HelicsException *pHVar15;
  RegistrationFailure *pRVar16;
  char *pcVar17;
  size_t sVar18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pair<int,_int> *prop;
  pointer ppVar19;
  FederateState *this_00;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view name_00;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  optional<unsigned_long> oVar20;
  string nname;
  handle feds;
  ActionMessage reg;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_1a8;
  value<fmt::v11::context> *local_1a0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_198;
  _Storage<unsigned_long,_true> local_180;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_178;
  value<fmt::v11::context> *pvStack_170;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_168 [2];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_158;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_150;
  undefined1 local_148 [16];
  CoreFederateInfo *local_138;
  BrokerBase *local_130;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_128;
  value<fmt::v11::context> *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [3];
  SmallBuffer local_e8;
  size_t local_68;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_1b8._M_str = name._M_str;
  local_1b8._M_len = name._M_len;
  bVar8 = waitCoreRegistration(this);
  if (!bVar8) {
    if (((this->super_BrokerBase).brokerState._M_i == ERRORED) &&
       ((this->super_BrokerBase).lastErrorString._M_string_length != 0)) {
      pRVar16 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      message_06._M_str = (this->super_BrokerBase).lastErrorString._M_dataplus._M_p;
      message_06._M_len = (this->super_BrokerBase).lastErrorString._M_string_length;
      RegistrationFailure::RegistrationFailure(pRVar16,message_06);
      __cxa_throw(pRVar16,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    pRVar16 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    pcVar17 = "core is unable to register and has timed out, federate cannot be registered";
    sVar18 = 0x4b;
LAB_002fa0ff:
    message_04._M_str = pcVar17;
    message_04._M_len = sVar18;
    RegistrationFailure::RegistrationFailure(pRVar16,message_04);
    __cxa_throw(pRVar16,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  if ((INITIALIZING < (this->super_BrokerBase).brokerState._M_i) &&
     ((this->super_BrokerBase).dynamicFederation == false)) {
    pRVar16 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    pcVar17 = "Core has already moved to operating state";
    sVar18 = 0x29;
    goto LAB_002fa0ff;
  }
  local_130 = &this->super_BrokerBase;
  __n1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_1b8,"${",0,2);
  local_178.values_ = (value<fmt::v11::context> *)local_168;
  pvStack_170 = (value<fmt::v11::context> *)0x0;
  local_168[0]._0_1_ = 0;
  if (__n1 != 0xffffffffffffffff) {
    local_158.values_ = (value<fmt::v11::context> *)local_1b8._M_str;
    local_150.values_ = (value<fmt::v11::context> *)local_1b8._M_len;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x9;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_158;
    ::fmt::v11::vformat_abi_cxx11_((string *)&local_1a8,(v11 *)"rename:{}",fmt,args);
    in_R9 = local_1a8;
    (*(this->super_Core)._vptr_Core[0x5e])(&local_128,this,4,"root",local_1a0,local_1a8.values_,0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.values_ != local_118) {
      operator_delete(local_128.values_,(ulong)(local_118[0]._M_allocated_capacity + 1));
    }
    if (&(local_1a8.values_)->field_0 != &local_198) {
      operator_delete(local_1a8.values_,(ulong)(local_198.long_long_value + 1));
    }
    pvVar7 = pvStack_170;
    aVar6 = local_178;
    if ((value<fmt::v11::context> *)local_1b8._M_len == pvStack_170) {
      if ((value<fmt::v11::context> *)local_1b8._M_len != (value<fmt::v11::context> *)0x0) {
        iVar11 = bcmp(local_1b8._M_str,local_178.values_,local_1b8._M_len);
        if (iVar11 != 0) goto LAB_002f9e1d;
      }
    }
    else {
LAB_002f9e1d:
      __str._M_str = (char *)aVar6.values_;
      __str._M_len = (size_t)pvVar7;
      iVar11 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                         ((basic_string_view<char,_std::char_traits<char>_> *)&local_1b8,0,__n1,
                          __str);
      if (iVar11 != 0) {
        sVar14 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_178,"error",0,5);
        if (sVar14 != 0xffffffffffffffff) {
          pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
          message_07._M_str =
               "automatic naming resulting in failure, may not be supported by broker";
          message_07._M_len = 0x45;
          HelicsException::HelicsException(pHVar15,message_07);
          *(undefined ***)pHVar15 = &PTR__HelicsException_005269c8;
          __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
        }
      }
      pcVar5 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar14 = (this->super_BrokerBase).identifier._M_string_length;
      local_128.values_ = (value<fmt::v11::context> *)local_1b8._M_str;
      local_120 = (value<fmt::v11::context> *)local_1b8._M_len;
      local_118[0]._M_allocated_capacity = local_178;
      local_118[0]._8_8_ = pvStack_170;
      fmt_00.size_ = 0xdd;
      fmt_00.data_ = (char *)0x1d;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_128;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_1a8,(v11 *)"generated name for fed {}->{}",fmt_00,args_00);
      local_68 = (size_t)local_1a0;
      aStack_60.args_ = local_1a8.args_;
      in_R9.values_ = (value<fmt::v11::context> *)0x0;
      message._M_str = (char *)local_1a8.values_;
      message._M_len = (size_t)local_1a0;
      name_00._M_str = pcVar5;
      name_00._M_len = sVar14;
      BrokerBase::sendToLogger(local_130,(GlobalFederateId)0x0,6,name_00,message,false);
      if (&(local_1a8.values_)->field_0 != &local_198) {
        operator_delete(local_1a8.values_,(ulong)(local_198.long_long_value + 1));
      }
      local_1b8._M_str = (char *)local_178;
      local_1b8._M_len = (size_t)pvStack_170;
    }
  }
  local_158.values_ = (value<fmt::v11::context> *)&this->federates;
  local_150.values_ = (value<fmt::v11::context> *)&(this->federates).m_mutex;
  local_148[0] = 0;
  std::unique_lock<std::shared_mutex>::lock((unique_lock<std::shared_mutex> *)&local_150);
  aVar6 = local_158;
  local_148[0] = 1;
  if ((this->super_BrokerBase).maxFederateCount <=
      (int)((ulong)((long)((local_158.values_)->field_0).custom.format -
                   ((local_158.values_)->field_0).long_long_value) >> 3)) {
    pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
    message_00._M_str = "maximum number of federates in the core has been reached";
    message_00._M_len = 0x38;
    HelicsException::HelicsException(pHVar15,message_00);
    *(undefined ***)pHVar15 = &PTR__HelicsException_005269c8;
    __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  local_128.values_ = (value<fmt::v11::context> *)local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,local_1b8._M_str,
             (long)(anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)local_1b8._M_len +
             (long)(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                   local_1b8._M_str);
  local_1a8.values_ = (value<fmt::v11::context> *)&local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,local_1b8._M_str,
             (long)(anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)local_1b8._M_len +
             (long)(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                   local_1b8._M_str);
  local_138 = info;
  oVar20 = gmlc::containers::MappedPointerVector<helics::FederateState,std::__cxx11::string>::
           insert<std::__cxx11::string,helics::CoreFederateInfo_const&>
                     ((MappedPointerVector<helics::FederateState,std::__cxx11::string> *)
                      aVar6.values_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_128,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1a8,info);
  _Var12._M_value =
       oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (local_1a8.values_ != (value<fmt::v11::context> *)&local_198) {
    operator_delete(local_1a8.values_,(ulong)(local_198.long_long_value + 1));
  }
  if (local_128.values_ != (value<fmt::v11::context> *)local_118) {
    operator_delete(local_128.values_,(ulong)(local_118[0]._M_allocated_capacity + 1));
  }
  aVar6 = local_158;
  if (((undefined1  [16])
       oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    if ((this->super_BrokerBase).dynamicFederation != true) {
      pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
      local_1a8.values_ = (value<fmt::v11::context> *)local_1b8._M_str;
      local_1a0 = (value<fmt::v11::context> *)local_1b8._M_len;
      fmt_02.size_ = 0xd;
      fmt_02.data_ = (char *)0x42;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)&local_1a8;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_128,
                 (v11 *)"duplicate names {} detected: multiple federates with the same name",fmt_02,
                 args_02);
      message_05._M_str = (char *)local_128.values_;
      message_05._M_len = (size_t)local_120;
      HelicsException::HelicsException(pHVar15,message_05);
      *(undefined ***)pHVar15 = &PTR__HelicsException_005269c8;
      __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    local_128.values_ = (value<fmt::v11::context> *)local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,local_1b8._M_str,
               (long)(anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *)local_1b8._M_len +
               (long)(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)
                     local_1b8._M_str);
    cVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((MappedPointerVector<helics::FederateState,std::__cxx11::string> *)
                        (aVar6.values_ + 1) + 8),(key_type *)&local_128);
    if (cVar13.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = (FederateState *)0x0;
    }
    else {
      this_00 = *(FederateState **)
                 ((long)((aVar6.values_)->field_0).pointer +
                 *(long *)((long)cVar13.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28) * 8);
    }
    if (local_128.values_ != (value<fmt::v11::context> *)local_118) {
      operator_delete(local_128.values_,(ulong)(local_118[0]._M_allocated_capacity + 1));
    }
    local_180._M_value._4_4_ = 0;
    local_180._M_value._0_4_ = (this_00->local_id).fid;
    bVar8 = FederateState::getOptionFlag(this_00,0x26);
    if (!bVar8) {
LAB_002f9fde:
      pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
      local_1a8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  local_1b8._M_str;
      local_1a0 = (value<fmt::v11::context> *)local_1b8._M_len;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x42;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_1a8;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_128,
                 (v11 *)"duplicate names {} detected: multiple federates with the same name",fmt_01,
                 args_01);
      message_02._M_str = (char *)local_128.values_;
      message_02._M_len = (size_t)local_120;
      HelicsException::HelicsException(pHVar15,message_02);
      *(undefined ***)pHVar15 = &PTR__HelicsException_005269c8;
      __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    FVar9 = FederateState::getState(this_00);
    if (FVar9 != FINISHED) goto LAB_002f9fde;
  }
  else {
    local_180._M_value = _Var12._M_value;
    if ((ulong)_Var12 <
        (ulong)((long)((local_158.values_)->field_0).custom.format -
                ((local_158.values_)->field_0).long_long_value >> 3)) {
      this_00 = *(FederateState **)
                 (((local_158.values_)->field_0).long_long_value + _Var12._M_value * 8);
    }
    else {
      this_00 = (FederateState *)0x0;
    }
  }
  p_Var2 = ((local_158.values_)->field_0).custom.format;
  lVar3 = ((local_158.values_)->field_0).long_long_value;
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)&local_150);
  if (this_00 == (FederateState *)0x0) {
    pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
    message_01._M_str = "unknown allocation error occurred";
    message_01._M_len = 0x21;
    HelicsException::HelicsException(pHVar15,message_01);
    *(undefined ***)pHVar15 = &PTR__HelicsException_005269c8;
    __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  if (((undefined1  [16])
       oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    FederateState::reset(this_00,local_138);
  }
  else {
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:775:24)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:775:24)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    FederateState::setLogger
              (this_00,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    (this_00->local_id).fid = (BaseType)local_180._M_value;
    this_00->mParent = this;
    if ((this->super_BrokerBase).enable_profiling == true) {
      FederateState::setOptionFlag(this_00,0x5d,true);
    }
  }
  ActionMessage::ActionMessage((ActionMessage *)&local_128,cmd_reg_fed);
  pcVar17 = local_1b8._M_str;
  local_e8.bufferSize = local_1b8._M_len;
  if (local_e8.heap == (byte *)local_1b8._M_str) {
  }
  else {
    SmallBuffer::reserve(&local_e8,local_1b8._M_len);
    if ((value<fmt::v11::context> *)local_e8.bufferSize != (value<fmt::v11::context> *)0x0) {
      memcpy(local_e8.heap,pcVar17,local_e8.bufferSize);
    }
  }
  if ((this->super_BrokerBase).observer == false) {
    bVar8 = FederateState::getOptionFlag(this_00,0);
    if (!bVar8) goto LAB_002f9c60;
  }
  local_118[0]._8_8_ = local_118[0]._8_8_ | 0x1000000;
LAB_002f9c60:
  bVar8 = FederateState::getOptionFlag(this_00,0x26);
  if (bVar8) {
    local_118[0]._8_8_ = local_118[0]._8_8_ | 0x4000000;
  }
  if (0 < this_00->indexGroup) {
    local_118[0]._8_2_ = (short)this_00->indexGroup;
  }
  BrokerBase::addActionMessage(local_130,(ActionMessage *)&local_128);
  if (((long)p_Var2 - lVar3 == 8 &
      oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged) != 0) {
    ppVar4 = (local_138->intProps).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar19 = (local_138->intProps).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppVar19 != ppVar4;
        ppVar19 = ppVar19 + 1) {
      uVar1 = ppVar19->first - 0x10f;
      if ((uVar1 < 4) && (uVar1 != 2)) {
        setIntegerProperty(this,(LocalFederateId)0xfffffefd,ppVar19->first,(int16_t)ppVar19->second)
        ;
      }
    }
  }
  IVar10 = FederateState::waitSetup(this_00);
  if (IVar10 == NEXT_STEP) {
    ActionMessage::~ActionMessage((ActionMessage *)&local_128);
    if ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)local_178.values_ !=
        local_168) {
      operator_delete(local_178.values_,CONCAT71(local_168[0]._1_7_,local_168[0]._0_1_) + 1);
    }
    return (LocalFederateId)(BaseType)local_180._M_value;
  }
  pHVar15 = (HelicsException *)__cxa_allocate_exception(0x28);
  local_158.values_ = (value<fmt::v11::context> *)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"fed received Failure ","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this_00->errorString);
  message_03._M_str = (char *)local_1a8.values_;
  message_03._M_len = (size_t)local_1a0;
  HelicsException::HelicsException(pHVar15,message_03);
  *(undefined ***)pHVar15 = &PTR__HelicsException_005269c8;
  __cxa_throw(pHVar15,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

LocalFederateId CommonCore::registerFederate(std::string_view name, const CoreFederateInfo& info)
{
    if (!waitCoreRegistration()) {
        if (getBrokerState() == BrokerState::ERRORED) {
            if (!lastErrorString.empty()) {
                throw(RegistrationFailure(lastErrorString));
            }
        }
        throw(RegistrationFailure(
            "core is unable to register and has timed out, federate cannot be registered"));
    }
    if (getBrokerState() >= BrokerState::OPERATING) {
        if (!dynamicFederation) {
            throw(RegistrationFailure("Core has already moved to operating state"));
        }
    }
    auto iloc = name.find("${");
    std::string nname;
    if (iloc != std::string_view::npos) {
        /** this will block*/
        nname = query("root",
                      fmt::format("rename:{}", name),
                      HelicsSequencingModes::HELICS_SEQUENCING_MODE_FAST);
        if (name != nname) {
            if (name.compare(0, iloc, nname) != 0 && nname.find("error") != std::string::npos) {
                throw(RegistrationFailure(
                    "automatic naming resulting in failure, may not be supported by broker"));
            }
            sendToLogger(parent_broker_id,
                         HELICS_LOG_LEVEL_SUMMARY,
                         getIdentifier(),
                         fmt::format("generated name for fed {}->{}", name, nname));
            name = nname;
        }
    }
    FederateState* fed = nullptr;
    bool checkProperties{false};
    bool newFed{true};
    LocalFederateId local_id;
    {
        auto feds = federates.lock();
        if (static_cast<decltype(maxFederateCount)>(feds->size()) >= maxFederateCount) {
            throw(RegistrationFailure("maximum number of federates in the core has been reached"));
        }

        auto fedid = feds->insert(std::string(name), std::string(name), info);
        if (fedid) {
            local_id = LocalFederateId(static_cast<int32_t>(*fedid));
            fed = (*feds)[*fedid];
        } else {
            if (dynamicFederation) {
                fed = feds->find(std::string(name));
                local_id = fed->local_id;
                if (!fed->getOptionFlag(HELICS_FLAG_REENTRANT) ||
                    fed->getState() != FederateStates::FINISHED) {
                    throw(RegistrationFailure(fmt::format(
                        "duplicate names {} detected: multiple federates with the same name",
                        name)));
                }
                newFed = false;
            } else {
                throw(RegistrationFailure(fmt::format(
                    "duplicate names {} detected: multiple federates with the same name", name)));
            }
        }

        if (feds->size() == 1 && newFed) {
            checkProperties = true;
        }
    }
    if (fed == nullptr) {
        throw(RegistrationFailure("unknown allocation error occurred"));
    }
    if (newFed) {
        // setting up the Logger
        // auto ptr = fed.get();
        // if we are using the Logger, log all messages coming from the federates so they can
        // control the level*/
        fed->setLogger([this](int level, std::string_view ident, std::string_view message) {
            sendToLogger(parent_broker_id, LogLevels::FED + level, ident, message);
        });

        fed->local_id = local_id;
        fed->setParent(this);
        if (enable_profiling) {
            fed->setOptionFlag(defs::PROFILING, true);
        }
    } else {
        fed->reset(info);
    }
    ActionMessage reg(CMD_REG_FED);
    reg.name(name);
    if (observer || fed->getOptionFlag(HELICS_FLAG_OBSERVER)) {
        setActionFlag(reg, observer_flag);
    }
    if (fed->getOptionFlag(HELICS_FLAG_REENTRANT)) {
        setActionFlag(reg, reentrant_flag);
    }
    if (fed->indexGroup > 0) {
        reg.counter = static_cast<int16_t>(fed->indexGroup);
    }
    addActionMessage(reg);
    // check some properties that should be inherited from the federate if it is the first one
    if (checkProperties) {
        // if this is the first federate then the core should inherit the logging level properties
        for (const auto& prop : info.intProps) {
            switch (prop.first) {
                case defs::Properties::LOG_LEVEL:
                case defs::Properties::FILE_LOG_LEVEL:
                case defs::Properties::CONSOLE_LOG_LEVEL:
                    setIntegerProperty(gLocalCoreId, prop.first, static_cast<int16_t>(prop.second));
                    break;
                default:
                    break;
            }
        }
    }
    // now wait for the federateQueue to get the response
    auto valid = fed->waitSetup();
    if (valid == IterationResult::NEXT_STEP) {
        return local_id;
    }
    throw(RegistrationFailure(std::string("fed received Failure ") + fed->lastErrorString()));
}